

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall
correctness_shr_long_Test::~correctness_shr_long_Test(correctness_shr_long_Test *this)

{
  void *in_RDI;
  
  ~correctness_shr_long_Test((correctness_shr_long_Test *)0x128058);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(correctness, shr_long)
{
    EXPECT_EQ(big_integer("4730073393008085198307104580698364137020387111323398632330851"),
              big_integer("151362348576258726345827346582347652384652387562348756234587245") >> 5);

    EXPECT_EQ(big_integer("1118311528397465815295799577134738919815767762822175104787"),
              big_integer("143143875634875624357862345873246581736418273641238413412741") >> 7);

    EXPECT_EQ(big_integer("-1591563309890326054125627839548891585559049824963"),
              big_integer("-3417856182746231874623148723164812376512852437523846123876") >> 31);

}